

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_3::ComplexityGuard::IsTooComplex
          (ComplexityGuard *this)

{
  ComplexityGuard *this_local;
  
  if ((this->state_->recursion_depth < 0x101) && (this->state_->steps < 0x20001)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsTooComplex() const {
    if (state_->recursion_depth > kRecursionDepthLimit ||
        state_->steps > kParseStepsLimit) {
#ifdef ABSL_INTERNAL_DEMANGLE_RECORDS_HIGH_WATER_MARK
      state_->too_complex = true;
#endif
      return true;
    }
    return false;
  }